

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::RenderPerformanceTestBase::setupVertexAttribs
          (RenderPerformanceTestBase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Functions *gl;
  RenderPerformanceTestBase *this_local;
  long lVar5;
  
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x610))(this->m_colorLoc);
  (**(code **)(lVar5 + 0x610))(this->m_positionLoc);
  (**(code **)(lVar5 + 0x19f0))(this->m_colorLoc,4,0x1406,0,0x20,0);
  (**(code **)(lVar5 + 0x19f0))(this->m_positionLoc,4,0x1406,0,0x20,0x10);
  pcVar1 = *(code **)(lVar5 + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(this->m_renderProgram);
  (*pcVar1)(dVar3);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"set up rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0xfa5);
  return;
}

Assistant:

void RenderPerformanceTestBase::setupVertexAttribs (void) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// buffers are bound

	gl.enableVertexAttribArray(m_colorLoc);
	gl.enableVertexAttribArray(m_positionLoc);

	gl.vertexAttribPointer(m_colorLoc,    4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(8 * sizeof(float)), (const tcu::Vec4*)DE_NULL + 0);
	gl.vertexAttribPointer(m_positionLoc, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(8 * sizeof(float)), (const tcu::Vec4*)DE_NULL + 1);

	gl.useProgram(m_renderProgram->getProgram());

	GLU_EXPECT_NO_ERROR(gl.getError(), "set up rendering");
}